

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void flatbuffers::GenField<unsigned_char>
               (FieldDef *fd,Table *table,bool fixed,int indent_step,int indent,string *_text)

{
  uchar local_49;
  string *_text_local;
  int indent_local;
  int indent_step_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  
  if (fixed) {
    local_49 = Struct::GetField<unsigned_char>((Struct *)table,(fd->value).offset);
  }
  else {
    local_49 = Table::GetField<unsigned_char>(table,(voffset_t)(fd->value).offset,'\0');
  }
  Print<unsigned_char>(local_49,(fd->value).type,indent,indent_step,(StructDef *)0x0,_text);
  return;
}

Assistant:

static void GenField(const FieldDef &fd,
                                          const Table *table, bool fixed,
                                          int indent_step, int indent,
                                          std::string *_text) {
  Print(fixed ?
    reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset) :
    table->GetField<T>(fd.value.offset, 0), fd.value.type, indent, indent_step,
                       nullptr, _text);
}